

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_rangeproof_verify
              (secp256k1_context *ctx,uint64_t *min_value,uint64_t *max_value,
              secp256k1_pedersen_commitment *commit,uchar *proof,size_t plen,uchar *extra_commit,
              size_t extra_commit_len,secp256k1_generator *gen)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  secp256k1_ge commitp;
  secp256k1_ge genp;
  secp256k1_ge local_e0;
  secp256k1_ge local_88;
  
  if (commit == (secp256k1_pedersen_commitment *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "commit != NULL";
  }
  else if (proof == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "proof != NULL";
  }
  else if (min_value == (uint64_t *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "min_value != NULL";
  }
  else if (max_value == (uint64_t *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "max_value != NULL";
  }
  else if (extra_commit_len == 0 || extra_commit != (uchar *)0x0) {
    if (gen == (secp256k1_generator *)0x0) {
      pvVar2 = (ctx->illegal_callback).data;
      pcVar3 = "gen != NULL";
    }
    else {
      if ((ctx->ecmult_ctx).pre_g != (secp256k1_ge_storage_0_ *)0x0) {
        secp256k1_pedersen_commitment_load(&local_e0,commit);
        secp256k1_generator_load(&local_88,gen);
        iVar1 = secp256k1_rangeproof_verify_impl
                          (&ctx->ecmult_ctx,(secp256k1_ecmult_gen_context *)0x0,(uchar *)0x0,
                           (uint64_t *)0x0,(uchar *)0x0,(size_t *)0x0,(uchar *)0x0,min_value,
                           max_value,&local_e0,proof,plen,extra_commit,extra_commit_len,&local_88);
        return iVar1;
      }
      pvVar2 = (ctx->illegal_callback).data;
      pcVar3 = "secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)";
    }
  }
  else {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "extra_commit != NULL || extra_commit_len == 0";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_rangeproof_verify(const secp256k1_context* ctx, uint64_t *min_value, uint64_t *max_value,
 const secp256k1_pedersen_commitment *commit, const unsigned char *proof, size_t plen, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_generator* gen) {
    secp256k1_ge commitp;
    secp256k1_ge genp;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(min_value != NULL);
    ARG_CHECK(max_value != NULL);
    ARG_CHECK(extra_commit != NULL || extra_commit_len == 0);
    ARG_CHECK(gen != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    secp256k1_pedersen_commitment_load(&commitp, commit);
    secp256k1_generator_load(&genp, gen);
    return secp256k1_rangeproof_verify_impl(&ctx->ecmult_ctx, NULL,
     NULL, NULL, NULL, NULL, NULL, min_value, max_value, &commitp, proof, plen, extra_commit, extra_commit_len, &genp);
}